

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

char * __thiscall QTableModel::index(QTableModel *this,char *__s,int __c)

{
  long *plVar1;
  int iVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  lVar4 = CONCAT44(in_register_00000014,__c);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lVar4 != 0) {
    uVar6 = (ulong)*(int *)(*(long *)(lVar4 + 0x30) + 8);
    if (-1 < (long)uVar6) {
      uVar3 = *(ulong *)(__s + 0x28);
      if (uVar3 <= uVar6) goto LAB_00591b79;
      if (*(long *)(*(long *)(__s + 0x20) + uVar6 * 8) != lVar4) goto LAB_00591b7e;
LAB_00591be6:
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      iVar2 = (**(code **)(*(long *)__s + 0x80))(__s,&local_50);
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      (**(code **)(*(long *)__s + 0x80))(__s,&local_50,(long)uVar6 % (long)iVar2 & 0xffffffff);
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractTableModel::index
                ((int)this,(int)__s,(QModelIndex *)((long)uVar6 / (long)iVar2 & 0xffffffff));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (char *)this;
      }
      goto LAB_00591c76;
    }
    uVar3 = *(ulong *)(__s + 0x28);
LAB_00591b79:
    if (uVar3 != 0) {
LAB_00591b7e:
      iVar2 = 1;
      lVar5 = 0;
      do {
        if (uVar3 * 8 == lVar5) goto LAB_00591ba9;
        iVar2 = iVar2 + -1;
        plVar1 = (long *)(*(long *)(__s + 0x20) + lVar5);
        lVar5 = lVar5 + 8;
      } while (*plVar1 != lVar4);
      if (iVar2 != 1) {
        uVar6 = (ulong)(uint)-iVar2;
        goto LAB_00591be6;
      }
    }
  }
LAB_00591ba9:
  *(undefined8 *)this = 0xffffffffffffffff;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    *(undefined8 *)&this->field_0x8 = 0;
    this->prototype = (QTableWidgetItem *)0x0;
    return (char *)this;
  }
LAB_00591c76:
  __stack_chk_fail();
}

Assistant:

QModelIndex QTableModel::index(const QTableWidgetItem *item) const
{
    if (!item)
        return QModelIndex();
    int i = -1;
    const int id = item->d->id;
    if (id >= 0 && id < tableItems.size() && tableItems.at(id) == item) {
        i = id;
    } else { // we need to search for the item
        i = tableItems.indexOf(const_cast<QTableWidgetItem*>(item));
        if (i == -1) // not found
            return QModelIndex();
    }
    int row = i / columnCount();
    int col = i % columnCount();
    return QAbstractTableModel::index(row, col);
}